

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

char * rapidjson::internal::Prettify(char *buffer,int length,int k,int maxDecimalPlaces)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = length + k;
  uVar4 = (ulong)uVar3;
  pcVar2 = (char *)CONCAT71((int7)(CONCAT44(in_register_0000000c,maxDecimalPlaces) >> 8),
                            0x15 < (int)uVar3 || k < 0);
  if (0x15 >= (int)uVar3 && k >= 0) {
    if (0 < k) {
      uVar5 = length + 1U;
      if ((int)(length + 1U) < (int)uVar3) {
        uVar5 = uVar3;
      }
      memset(buffer + length,0x30,(ulong)(~length + uVar5) + 1);
    }
    pcVar2 = buffer + (int)uVar3;
    pcVar2[0] = '.';
    pcVar2[1] = '0';
    return pcVar2 + 2;
  }
  uVar5 = uVar3 - 1;
  if (uVar5 < 0x15) {
    memmove(buffer + uVar4 + 1,buffer + uVar4,(long)-k);
    buffer[uVar4] = '.';
    if (-1 < k + maxDecimalPlaces) {
      return buffer + (long)length + 1;
    }
    bVar1 = 1 < maxDecimalPlaces;
    if (1 < maxDecimalPlaces) {
      pcVar2 = (char *)((uint)maxDecimalPlaces + uVar4);
      if (buffer[(long)pcVar2] == '0') {
        do {
          uVar5 = (int)pcVar2 - 1;
          pcVar2 = (char *)(ulong)uVar5;
          bVar1 = (int)(uVar3 + 1) < (int)uVar5;
          if ((int)uVar5 <= (int)(uVar3 + 1)) goto LAB_0036ad79;
        } while (buffer[uVar5] == '0');
      }
      pcVar2 = buffer + (long)(int)pcVar2 + 1;
    }
LAB_0036ad79:
    if (!bVar1) {
      return buffer + uVar4 + 2;
    }
    return pcVar2;
  }
  if (uVar3 + 5 < 6) {
    uVar5 = 2 - uVar3;
    memmove(buffer + uVar5,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    if ((int)uVar3 < 0) {
      uVar3 = 3;
      if (3 < (int)uVar5) {
        uVar3 = uVar5;
      }
      memset(buffer + 2,0x30,(ulong)(uVar3 - 2));
    }
    if (-k <= maxDecimalPlaces) {
      return buffer + (int)(uVar5 + length);
    }
    bVar1 = maxDecimalPlaces < 2;
    if (1 < maxDecimalPlaces) {
      pcVar2 = (char *)(ulong)(uint)maxDecimalPlaces;
      if ((buffer + 1)[(long)pcVar2] == '0') {
        do {
          bVar1 = (int)(maxDecimalPlaces + 1U) < 4;
          if (SBORROW4(maxDecimalPlaces + 1U,4) != (int)(maxDecimalPlaces - 3U) < 0)
          goto LAB_0036ade8;
          pcVar2 = (char *)(ulong)(uint)maxDecimalPlaces;
          maxDecimalPlaces = maxDecimalPlaces - 1;
        } while (buffer[(long)pcVar2] == '0');
      }
      else {
        pcVar2 = pcVar2 + 1;
      }
      pcVar2 = pcVar2 + (long)buffer + 1;
    }
LAB_0036ade8:
    if (bVar1) {
      return buffer + 3;
    }
    return pcVar2;
  }
  if (SBORROW4(uVar3,-maxDecimalPlaces) != (int)(uVar3 + maxDecimalPlaces) < 0) {
    buffer[0] = '0';
    buffer[1] = '.';
    buffer[2] = '0';
    goto LAB_0036ae38;
  }
  if (length == 1) {
    buffer[1] = 'e';
    if ((int)uVar5 < 0) {
LAB_0036adf7:
      buffer[2] = '-';
      buffer = buffer + 3;
      uVar5 = 1 - uVar3;
    }
    else {
      buffer = buffer + 2;
    }
  }
  else {
    memmove(buffer + 2,buffer + 1,(long)(length + -1));
    buffer[1] = '.';
    buffer[(long)length + 1] = 'e';
    if ((int)uVar5 < 0) {
      buffer = buffer + length;
      goto LAB_0036adf7;
    }
    buffer = buffer + (long)length + 2;
  }
  if ((int)uVar5 < 100) {
    if (9 < (int)uVar5) {
      *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar5 * 2);
      return buffer + 2;
    }
    *buffer = (char)uVar5 + '0';
    return buffer + 1;
  }
  *buffer = (char)(uVar5 / 100) + '0';
  *(undefined2 *)(buffer + 1) =
       *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar5 % 100) * 2);
LAB_0036ae38:
  return buffer + 3;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k, int maxDecimalPlaces) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (0 <= k && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], static_cast<size_t>(length - kk));
        buffer[kk] = '.';
        if (0 > k + maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 1.2345 -> 1.23, 1.102 -> 1.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = kk + maxDecimalPlaces; i > kk + 1; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[kk + 2]; // Reserve one zero
        }
        else
            return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], static_cast<size_t>(length));
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        if (length - kk > maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 0.123 -> 0.12, 0.102 -> 0.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = maxDecimalPlaces + 1; i > 2; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[3]; // Reserve one zero
        }
        else
            return &buffer[length + offset];
    }
    else if (kk < -maxDecimalPlaces) {
        // Truncate to zero
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], static_cast<size_t>(length - 1));
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}